

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_img_compress(fitsfile *infptr,fitsfile *outfptr,int *status)

{
  int iVar1;
  int *in_RDX;
  fitsfile *in_RSI;
  long naxes [6];
  int naxis;
  int bitpix;
  int *in_stack_000000b0;
  fitsfile *in_stack_000000b8;
  int *in_stack_000000c8;
  fitsfile *in_stack_000000d0;
  fitsfile *in_stack_000000d8;
  int *in_stack_00000158;
  undefined4 in_stack_00000160;
  int in_stack_00000164;
  fitsfile *in_stack_00000168;
  int in_stack_00000170;
  int in_stack_00000174;
  fitsfile *in_stack_00000178;
  int *in_stack_00000220;
  fitsfile *in_stack_00000228;
  fitsfile *in_stack_00000230;
  long *in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  fitsfile *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  if (*in_RDX < 1) {
    iVar1 = ffgipr(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)0x1ec66e);
    if (iVar1 < 1) {
      if ((in_stack_ffffffffffffffd8 < 1) || (6 < in_stack_ffffffffffffffd8)) {
        ffpmsg((char *)0x1ec69d);
        *in_RDX = 0xd4;
        local_4 = 0xd4;
      }
      else {
        ffcrhd(in_stack_ffffffffffffffc8,
               (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (in_RSI->Fptr->curhdu == 0) {
          ffcrim((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                 (long *)in_stack_ffffffffffffffc8,
                 (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          ffcrhd(in_stack_ffffffffffffffc8,
                 (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        }
        else {
          fits_unset_compression_param(in_RSI,in_RDX);
        }
        fits_set_compression_pref(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
        if ((in_RSI->Fptr->request_lossy_int_compress != 0) && (0 < in_stack_ffffffffffffffdc)) {
          in_stack_ffffffffffffffdc = -0x20;
        }
        iVar1 = imcomp_init_table(in_stack_00000178,in_stack_00000174,in_stack_00000170,
                                  (long *)in_stack_00000168,in_stack_00000164,in_stack_00000158);
        if (iVar1 < 1) {
          iVar1 = imcomp_copy_img2comp
                            (in_stack_00000168,
                             (fitsfile *)CONCAT44(in_stack_00000164,in_stack_00000160),
                             in_stack_00000158);
          if (iVar1 < 1) {
            if ((in_RSI->Fptr->request_lossy_int_compress == 0) && (0 < in_stack_ffffffffffffffdc))
            {
              ffpscl(in_stack_ffffffffffffffc8,
                     (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (double)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            }
            ffrdef(in_stack_000000b8,in_stack_000000b0);
            if ((in_RSI->Fptr->request_lossy_int_compress == 0) && (0 < in_stack_ffffffffffffffdc))
            {
              ffpscl(in_stack_ffffffffffffffc8,
                     (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (double)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
            }
            imcomp_compress_image(in_stack_00000230,in_stack_00000228,in_stack_00000220);
            ffrdef(in_stack_000000b8,in_stack_000000b0);
            fits_unset_compression_request(in_RSI,in_RDX);
            local_4 = *in_RDX;
          }
          else {
            local_4 = *in_RDX;
          }
        }
        else {
          local_4 = *in_RDX;
        }
      }
    }
    else {
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int fits_img_compress(fitsfile *infptr, /* pointer to image to be compressed */
                 fitsfile *outfptr, /* empty HDU for output compressed image */
                 int *status)       /* IO - error status               */

/*
   This routine initializes the output table, copies all the keywords,
   and  loops through the input image, compressing the data and
   writing the compressed tiles to the output table.
   
   This is a high level routine that is called by the fpack and funpack
   FITS compression utilities.
*/
{
    int bitpix, naxis;
    long naxes[MAX_COMPRESS_DIM];
/*    int c1, c2, c3; */

    if (*status > 0)
        return(*status);


    /* get datatype and size of input image */
    if (fits_get_img_param(infptr, MAX_COMPRESS_DIM, &bitpix, 
                       &naxis, naxes, status) > 0)
        return(*status);

    if (naxis < 1 || naxis > MAX_COMPRESS_DIM)
    {
        ffpmsg("Image cannot be compressed: NAXIS out of range");
        return(*status = BAD_NAXIS);
    }

    /* create a new empty HDU in the output file now, before setting the */
    /* compression preferences.  This HDU will become a binary table that */
    /* contains the compressed image.  If necessary, create a dummy primary */
    /* array, which much precede the binary table extension. */
    
    ffcrhd(outfptr, status);  /* this does nothing if the output file is empty */

    if ((outfptr->Fptr)->curhdu == 0)  /* have to create dummy primary array */
    {
       ffcrim(outfptr, 16, 0, NULL, status);
       ffcrhd(outfptr, status);
    } else {
        /* unset any compress parameter preferences that may have been
           set when closing the previous HDU in the output file */
        fits_unset_compression_param(outfptr, status);
    }
    
    /* set any compress parameter preferences as given in the input file */
    fits_set_compression_pref(infptr, outfptr, status);

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
/* do this in imcomp_get_compressed_image_par, instead
    if ( (outfptr->Fptr)->request_quantize_level != 0.)
        (outfptr->Fptr)->quantize_level = (outfptr->Fptr)->request_quantize_level;
*/
    /* if requested, treat integer images same as a float image. */
    /* Then the pixels will be quantized (lossy algorithm) to achieve */
    /* higher amounts of compression than with lossless algorithms */

    if ( (outfptr->Fptr)->request_lossy_int_compress != 0  && bitpix > 0) 
	bitpix = FLOAT_IMG;  /* compress integer images as if float */

    /* initialize output table */
    if (imcomp_init_table(outfptr, bitpix, naxis, naxes, 0, status) > 0)
        return (*status);    

    /* Copy the image header keywords to the table header. */
    if (imcomp_copy_img2comp(infptr, outfptr, status) > 0)
	    return (*status);

    /* turn off any intensity scaling (defined by BSCALE and BZERO */
    /* keywords) so that unscaled values will be read by CFITSIO */
    /* (except if quantizing an int image, same as a float image) */
    if ( (outfptr->Fptr)->request_lossy_int_compress == 0 && bitpix > 0) 
        ffpscl(infptr, 1.0, 0.0, status);

    /* force a rescan of the output file keywords, so that */
    /* the compression parameters will be copied to the internal */
    /* fitsfile structure used by CFITSIO */
    ffrdef(outfptr, status);

    /* turn off any intensity scaling (defined by BSCALE and BZERO */
    /* keywords) so that unscaled values will be written by CFITSIO */
    /* (except if quantizing an int image, same as a float image) */
    if ( (outfptr->Fptr)->request_lossy_int_compress == 0 && bitpix > 0) 
        ffpscl(outfptr, 1.0, 0.0, status);

    /* Read each image tile, compress, and write to a table row. */
    imcomp_compress_image (infptr, outfptr, status);

    /* force another rescan of the output file keywords, to */
    /* update PCOUNT and TFORMn = '1PB(iii)' keyword values. */
    ffrdef(outfptr, status);

    /* unset any previously set compress parameter preferences */
    fits_unset_compression_request(outfptr, status);

/*
    fits_get_case(&c1, &c2, &c3);
    printf("c1, c2, c3 = %d, %d, %d\n", c1, c2, c3); 
*/

    return (*status);
}